

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O2

string * __thiscall phosg::MD5::hex_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->a0;
  uVar2 = this->b0;
  uVar3 = this->c0;
  uVar4 = this->d0;
  string_printf_abi_cxx11_
            (__return_storage_ptr__,"%08X%08X%08X%08X",
             (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    ),(ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18),
             (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    ),(ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18));
  return __return_storage_ptr__;
}

Assistant:

string MD5::hex() const {
  return phosg::string_printf("%08" PRIX32 "%08" PRIX32 "%08" PRIX32 "%08" PRIX32,
      bswap32(this->a0), bswap32(this->b0), bswap32(this->c0), bswap32(this->d0));
}